

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O3

void __thiscall
gss::innards::Proof::incompatible_by_degrees
          (Proof *this,int g,NamedVertex *p,vector<int,_std::allocator<int>_> *n_p,NamedVertex *t,
          vector<int,_std::allocator<int>_> *n_t)

{
  long *plVar1;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar2;
  int *piVar3;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var4;
  NamedVertex *pNVar5;
  NamedVertex *pNVar6;
  ostream *poVar7;
  const_iterator cVar8;
  mapped_type *pmVar9;
  map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_00;
  bool bVar10;
  int *n;
  int *piVar11;
  int *n_3;
  long lVar12;
  vector<int,_std::allocator<int>_> *__range2;
  char local_71;
  NamedVertex *local_70;
  NamedVertex *local_68;
  key_type local_60;
  vector<int,_std::allocator<int>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  uVar2._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (((this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream)._M_t
  ;
  local_40 = n_t;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar2._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,"* cannot map ",0xd);
  local_70 = p;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)
                      uVar2._M_t.
                      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl,(p->second)._M_dataplus._M_p,(p->second)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," to ",4);
  local_68 = t;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(t->second)._M_dataplus._M_p,(t->second)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," due to degrees in graph pairs ",0x1f);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,g);
  local_60.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>
  ._M_head_impl._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_60,1);
  pNVar6 = local_68;
  pNVar5 = local_70;
  if (((this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->recover_encoding ==
      true) {
    piVar3 = (n_p->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    for (piVar11 = (n_p->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start; local_38 = n_p, piVar11 != piVar3;
        piVar11 = piVar11 + 1) {
      recover_adjacency_lines(this,g,pNVar5->first,*piVar11,pNVar6->first);
      n_p = local_38;
    }
    piVar3 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar11 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start; piVar11 != piVar3; piVar11 = piVar11 + 1) {
      recover_injectivity_constraint(this,*piVar11);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,"p",1);
  piVar11 = (n_p->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar3 = (n_p->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar11 != piVar3) {
    lVar12 = (long)g;
    bVar10 = true;
    do {
      _Var4._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
      local_60.super__Tuple_impl<0UL,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
      super__Head_base<2UL,_long,_false>._M_head_impl = (long)*piVar11;
      local_60.super__Tuple_impl<0UL,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_long,_long,_long>.super__Head_base<1UL,_long,_false>._M_head_impl =
           (long)local_70->first;
      local_60.super__Tuple_impl<0UL,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
      super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl =
           (_Head_base<3UL,_long,_false>)(long)local_68->first;
      local_60.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Head_base<0UL,_long,_false>.
      _M_head_impl = lVar12;
      cVar8 = std::
              _Rb_tree<std::tuple<long,_long,_long,_long>,_std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::find(&((_Var4._M_head_impl)->adjacency_lines)._M_t,&local_60);
      if (cVar8._M_node != (_Base_ptr)((long)&(_Var4._M_head_impl)->adjacency_lines + 8U)) {
        uVar2._M_t.
        super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
        .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
        _M_head_impl = (((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       proof_stream)._M_t;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   uVar2._M_t.
                   super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                   ._M_head_impl," ",1);
        this_00 = &((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                    .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                   adjacency_lines;
        if (bVar10) {
          local_60.super__Tuple_impl<0UL,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
          super__Head_base<2UL,_long,_false>._M_head_impl = (long)*piVar11;
          local_60.super__Tuple_impl<0UL,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
          super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl =
               (_Head_base<3UL,_long,_false>)(long)local_68->first;
          local_60.super__Tuple_impl<0UL,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_long,_long,_long>.super__Head_base<1UL,_long,_false>._M_head_impl =
               (long)local_70->first;
          local_60.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Head_base<0UL,_long,_false>
          ._M_head_impl = lVar12;
          std::
          map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator[](this_00,&local_60);
          std::ostream::_M_insert<long>
                    ((long)uVar2._M_t.
                           super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                           ._M_head_impl);
        }
        else {
          local_60.super__Tuple_impl<0UL,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
          super__Head_base<2UL,_long,_false>._M_head_impl = (long)*piVar11;
          local_60.super__Tuple_impl<0UL,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
          super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl =
               (_Head_base<3UL,_long,_false>)(long)local_68->first;
          local_60.super__Tuple_impl<0UL,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_long,_long,_long>.super__Head_base<1UL,_long,_false>._M_head_impl =
               (long)local_70->first;
          local_60.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Head_base<0UL,_long,_false>
          ._M_head_impl = lVar12;
          std::
          map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator[](this_00,&local_60);
          poVar7 = std::ostream::_M_insert<long>
                             ((long)uVar2._M_t.
                                    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                    ._M_head_impl);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," +",2);
        }
        bVar10 = false;
      }
      piVar11 = piVar11 + 1;
    } while (piVar11 != piVar3);
  }
  piVar11 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar3 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if (piVar11 != piVar3) {
    do {
      uVar2._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 uVar2._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl," ",1);
      local_60.super__Tuple_impl<0UL,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
      super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl =
           (_Head_base<3UL,_long,_false>)(long)*piVar11;
      std::
      map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator[](&((this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                    injectivity_constraints,(key_type_conflict1 *)&local_60);
      poVar7 = std::ostream::_M_insert<long>
                         ((long)uVar2._M_t.
                                super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                ._M_head_impl);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," +",2);
      piVar11 = piVar11 + 1;
    } while (piVar11 != piVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t," s 0\n",5);
  _Var4._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  plVar1 = &(_Var4._M_head_impl)->proof_line;
  *plVar1 = *plVar1 + 1;
  uVar2._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       ((_Var4._M_head_impl)->proof_stream)._M_t;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar2._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,"ia 1 ~x",7);
  pNVar6 = local_68;
  pNVar5 = local_70;
  local_60.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>
  ._M_head_impl = (_Head_base<3UL,_long,_false>)(long)local_70->first;
  local_60.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)local_68->first;
  pmVar9 = std::
           map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         variable_mappings,(key_type *)&local_60);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)
                      uVar2._M_t.
                      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl,(pmVar9->_M_dataplus)._M_p,pmVar9->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," >= 1 ; ",8);
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  local_71 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_71,1);
  _Var4._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  (_Var4._M_head_impl)->proof_line = (_Var4._M_head_impl)->proof_line + 1;
  local_60.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>
  ._M_head_impl._4_4_ = pNVar6->first;
  local_60.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>
  ._M_head_impl._0_4_ = pNVar5->first;
  std::
  _Rb_tree<std::pair<long,long>,std::pair<std::pair<long,long>const,long>,std::_Select1st<std::pair<std::pair<long,long>const,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,long>>>
  ::_M_emplace_unique<std::pair<int,int>,long&>
            ((_Rb_tree<std::pair<long,long>,std::pair<std::pair<long,long>const,long>,std::_Select1st<std::pair<std::pair<long,long>const,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,long>>>
              *)&(_Var4._M_head_impl)->eliminations,(pair<int,_int> *)&local_60,
             &(_Var4._M_head_impl)->proof_line);
  uVar2._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (((this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream)._M_t
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar2._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,"d ",2);
  poVar7 = std::ostream::_M_insert<long>
                     ((long)uVar2._M_t.
                            super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                            ._M_head_impl);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," 0\n",3);
  return;
}

Assistant:

auto Proof::incompatible_by_degrees(
    int g,
    const NamedVertex & p,
    const vector<int> & n_p,
    const NamedVertex & t,
    const vector<int> & n_t) -> void
{
    *_imp->proof_stream << "* cannot map " << p.second << " to " << t.second << " due to degrees in graph pairs " << g << '\n';

    if (_imp->recover_encoding) {
        for (auto & n : n_p)
            recover_adjacency_lines(g, p.first, n, t.first);
        for (auto & n : n_t)
            recover_injectivity_constraint(n);
    }

    *_imp->proof_stream << "p";
    bool first = true;
    for (auto & n : n_p) {
        // due to loops or labels, it might not be possible to map n to t.first
        if (_imp->adjacency_lines.count(tuple{g, p.first, n, t.first})) {
            if (first) {
                first = false;
                *_imp->proof_stream << " " << get<1>(_imp->adjacency_lines[tuple{g, p.first, n, t.first}]);
            }
            else
                *_imp->proof_stream << " " << get<1>(_imp->adjacency_lines[tuple{g, p.first, n, t.first}]) << " +";
        }
    }

    // if I map p to t, I have to map the neighbours of p to neighbours of t
    for (auto & n : n_t)
        *_imp->proof_stream << " " << get<1>(_imp->injectivity_constraints[n]) << " +";

    *_imp->proof_stream << " s 0\n";
    ++_imp->proof_line;

    *_imp->proof_stream << "ia 1 ~x" << _imp->variable_mappings[pair{p.first, t.first}] << " >= 1 ; " << _imp->proof_line << '\n';
    ++_imp->proof_line;
    _imp->eliminations.emplace(pair{p.first, t.first}, _imp->proof_line);

    *_imp->proof_stream << "d " << _imp->proof_line - 1 << " 0\n";
}